

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

void __thiscall
iDynTree::PrismaticJoint::computeJointTorque
          (PrismaticJoint *this,VectorDynSize *jntPos,Wrench *internalWrench,
          LinkIndex linkThatAppliesWrench,LinkIndex linkOnWhichWrenchIsApplied,
          VectorDynSize *jntTorques)

{
  ulong uVar1;
  double *pdVar2;
  long *in_RDI;
  undefined8 in_R8;
  VectorDynSize *in_R9;
  double dVar3;
  SpatialMotionVector S;
  double *tau;
  undefined1 local_68 [16];
  DualVectorT *in_stack_ffffffffffffffa8;
  SpatialVector<iDynTree::SpatialMotionVector> *in_stack_ffffffffffffffb0;
  
  uVar1 = (**(code **)(*in_RDI + 0xc0))();
  pdVar2 = (double *)iDynTree::VectorDynSize::operator()(in_R9,uVar1);
  (**(code **)(*in_RDI + 0x60))(local_68,in_RDI,0,in_R8,LINK_INVALID_INDEX);
  dVar3 = SpatialVector<iDynTree::SpatialMotionVector>::dot
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *pdVar2 = dVar3;
  return;
}

Assistant:

void PrismaticJoint::computeJointTorque(const VectorDynSize& jntPos, const Wrench& internalWrench,
                                       LinkIndex linkThatAppliesWrench, LinkIndex linkOnWhichWrenchIsApplied,
                                       VectorDynSize& jntTorques) const
{
    double & tau = jntTorques(this->getDOFsOffset());

    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,linkOnWhichWrenchIsApplied);
    tau = S.dot(internalWrench);

    return;
}